

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O3

int mbedtls_rsa_rsaes_oaep_encrypt
              (mbedtls_rsa_context *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng,
              int mode,uchar *label,size_t label_len,size_t ilen,uchar *input,uchar *output)

{
  uchar *output_00;
  uchar *src;
  ulong __n;
  long lVar1;
  byte bVar2;
  int iVar3;
  mbedtls_md_info_t *md_info;
  ulong uVar4;
  ulong slen;
  mbedtls_md_context_t md_ctx;
  mbedtls_md_context_t local_48;
  
  if (mode == 1) {
    if (f_rng == (_func_int_void_ptr_uchar_ptr_size_t *)0x0) {
      return -0x4080;
    }
    if (ctx->padding != 1) {
      return -0x4080;
    }
  }
  else if (f_rng == (_func_int_void_ptr_uchar_ptr_size_t *)0x0) {
    return -0x4080;
  }
  md_info = mbedtls_md_info_from_type(ctx->hash_id);
  iVar3 = -0x4080;
  if (md_info != (mbedtls_md_info_t *)0x0) {
    __n = ctx->len;
    bVar2 = mbedtls_md_get_size(md_info);
    slen = (ulong)bVar2;
    uVar4 = slen * 2 + 2 + ilen;
    if (uVar4 <= __n && ilen <= uVar4) {
      memset(output,0,__n);
      src = output + 1;
      *output = '\0';
      iVar3 = (*f_rng)(p_rng,src,slen);
      if (iVar3 == 0) {
        output_00 = src + slen;
        iVar3 = mbedtls_md(md_info,label,label_len,output_00);
        if (iVar3 == 0) {
          lVar1 = (__n - ilen) - slen;
          output_00[lVar1 + -2] = '\x01';
          memcpy(output_00 + lVar1 + -1,input,ilen);
          mbedtls_md_init(&local_48);
          iVar3 = mbedtls_md_setup(&local_48,md_info,0);
          if (iVar3 == 0) {
            iVar3 = mgf_mask(output + slen + 1,__n + ~slen,src,slen,&local_48);
            if (iVar3 == 0) {
              iVar3 = mgf_mask(src,slen,output + slen + 1,__n + ~slen,&local_48);
              mbedtls_md_free(&local_48);
              if (iVar3 != 0) {
                return iVar3;
              }
              if (mode != 0) {
                iVar3 = mbedtls_rsa_private(ctx,f_rng,p_rng,output,output);
                return iVar3;
              }
              iVar3 = mbedtls_rsa_public(ctx,output,output);
              return iVar3;
            }
          }
          mbedtls_md_free(&local_48);
        }
      }
      else {
        iVar3 = iVar3 + -0x4480;
      }
    }
  }
  return iVar3;
}

Assistant:

int mbedtls_rsa_rsaes_oaep_encrypt( mbedtls_rsa_context *ctx,
                            int (*f_rng)(void *, unsigned char *, size_t),
                            void *p_rng,
                            int mode,
                            const unsigned char *label, size_t label_len,
                            size_t ilen,
                            const unsigned char *input,
                            unsigned char *output )
{
    size_t olen;
    int ret;
    unsigned char *p = output;
    unsigned int hlen;
    const mbedtls_md_info_t *md_info;
    mbedtls_md_context_t md_ctx;

    if( mode == MBEDTLS_RSA_PRIVATE && ctx->padding != MBEDTLS_RSA_PKCS_V21 )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    if( f_rng == NULL )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    md_info = mbedtls_md_info_from_type( (mbedtls_md_type_t) ctx->hash_id );
    if( md_info == NULL )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    olen = ctx->len;
    hlen = mbedtls_md_get_size( md_info );

    /* first comparison checks for overflow */
    if( ilen + 2 * hlen + 2 < ilen || olen < ilen + 2 * hlen + 2 )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    memset( output, 0, olen );

    *p++ = 0;

    /* Generate a random octet string seed */
    if( ( ret = f_rng( p_rng, p, hlen ) ) != 0 )
        return( MBEDTLS_ERR_RSA_RNG_FAILED + ret );

    p += hlen;

    /* Construct DB */
    if( ( ret = mbedtls_md( md_info, label, label_len, p ) ) != 0 )
        return( ret );
    p += hlen;
    p += olen - 2 * hlen - 2 - ilen;
    *p++ = 1;
    memcpy( p, input, ilen );

    mbedtls_md_init( &md_ctx );
    if( ( ret = mbedtls_md_setup( &md_ctx, md_info, 0 ) ) != 0 )
        goto exit;

    /* maskedDB: Apply dbMask to DB */
    if( ( ret = mgf_mask( output + hlen + 1, olen - hlen - 1, output + 1, hlen,
                          &md_ctx ) ) != 0 )
        goto exit;

    /* maskedSeed: Apply seedMask to seed */
    if( ( ret = mgf_mask( output + 1, hlen, output + hlen + 1, olen - hlen - 1,
                          &md_ctx ) ) != 0 )
        goto exit;

exit:
    mbedtls_md_free( &md_ctx );

    if( ret != 0 )
        return( ret );

    return( ( mode == MBEDTLS_RSA_PUBLIC )
            ? mbedtls_rsa_public(  ctx, output, output )
            : mbedtls_rsa_private( ctx, f_rng, p_rng, output, output ) );
}